

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SwapExtension_Test::TestBody
          (ExtensionSetTest_SwapExtension_Test *this)

{
  bool bVar1;
  Reflection *this_00;
  char *in_R9;
  AssertHelper AStack_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  string local_b8;
  AssertionResult gtest_ar_;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  TestAllExtensions message1;
  TestAllExtensions message2;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&message1);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&message2);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&message1);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = proto2_unittest::TestAllExtensions::GetReflection();
  Reflection::SwapFields(this_00,&message1.super_Message,&message2.super_Message,&fields);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&message1);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>(&message2);
  local_b8._M_dataplus._M_p = (pointer)Reflection::FindKnownExtensionByNumber(this_00,0xc);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&fields,(FieldDescriptor **)&local_b8);
  local_b8._M_dataplus._M_p = (pointer)Reflection::FindKnownExtensionByNumber(this_00,0x19);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&fields,(FieldDescriptor **)&local_b8);
  Reflection::SwapFields(this_00,&message1.super_Message,&message2.super_Message,&fields);
  gtest_ar_.success_ =
       proto2_unittest::TestAllExtensions::
       HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                 (&message1,
                  (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                   *)&proto2_unittest::optional_int32_extension);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message1.HasExtension(unittest::optional_int32_extension)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x143,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                    (&message1,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                      *)proto2_unittest::optional_double_extension);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message1.HasExtension(unittest::optional_double_extension)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x144,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                    (&message1,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::optional_cord_extension);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message1.HasExtension(unittest::optional_cord_extension)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x145,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bVar1 = proto2_unittest::TestAllExtensions::
          HasExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,(unsigned_char)5,false,google::protobuf::internal::PrimitiveTypeTraits<int>>
                    (&message2,
                     (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::optional_int32_extension);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message2.HasExtension(unittest::optional_int32_extension)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x147,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       proto2_unittest::TestAllExtensions::
       HasExtension<google::protobuf::internal::PrimitiveTypeTraits<double>,(unsigned_char)1,false,google::protobuf::internal::PrimitiveTypeTraits<double>>
                 (&message2,
                  (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::PrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                   *)proto2_unittest::optional_double_extension);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message2.HasExtension(unittest::optional_double_extension)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x148,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       proto2_unittest::TestAllExtensions::
       HasExtension<google::protobuf::internal::StringTypeTraits,(unsigned_char)12,false,google::protobuf::internal::StringTypeTraits>
                 (&message2,
                  (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::StringTypeTraits,_(unsigned_char)__f_,_false>
                   *)proto2_unittest::optional_cord_extension);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)"message2.HasExtension(unittest::optional_cord_extension)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x149,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&message2);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&message1);
  return;
}

Assistant:

TEST(ExtensionSetTest, SwapExtension) {
  unittest::TestAllExtensions message1;
  unittest::TestAllExtensions message2;

  TestUtil::SetAllExtensions(&message1);
  std::vector<const FieldDescriptor*> fields;

  // Swap empty fields.
  const Reflection* reflection = message1.GetReflection();
  reflection->SwapFields(&message1, &message2, fields);
  TestUtil::ExpectAllExtensionsSet(message1);
  TestUtil::ExpectExtensionsClear(message2);

  // Swap two extensions.
  fields.push_back(reflection->FindKnownExtensionByNumber(12));
  fields.push_back(reflection->FindKnownExtensionByNumber(25));
  reflection->SwapFields(&message1, &message2, fields);

  EXPECT_TRUE(message1.HasExtension(unittest::optional_int32_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_double_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_cord_extension));

  EXPECT_FALSE(message2.HasExtension(unittest::optional_int32_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_double_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_cord_extension));
}